

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

const_iterator __thiscall
QHash<FixStringCacheKey,_QString>::constFindImpl<FixStringCacheKey>
          (QHash<FixStringCacheKey,_QString> *this,FixStringCacheKey *key)

{
  piter it_00;
  bool bVar1;
  Data<QHashPrivate::Node<FixStringCacheKey,_QString>_> *in_RDI;
  long in_FS_OFFSET;
  Bucket it;
  const_iterator *in_stack_ffffffffffffff98;
  Data<QHashPrivate::Node<FixStringCacheKey,_QString>_> *in_stack_ffffffffffffffa0;
  FixStringCacheKey *in_stack_ffffffffffffffa8;
  Bucket local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty((QHash<FixStringCacheKey,_QString> *)in_RDI);
  if (bVar1) {
    local_18 = (piter)end((QHash<FixStringCacheKey,_QString> *)in_stack_ffffffffffffffa8);
  }
  else {
    local_28.index = 0xaaaaaaaaaaaaaaaa;
    local_28.span = (Span *)0xaaaaaaaaaaaaaaaa;
    local_28 = QHashPrivate::Data<QHashPrivate::Node<FixStringCacheKey,_QString>_>::
               findBucket<FixStringCacheKey>(in_RDI,in_stack_ffffffffffffffa8);
    bVar1 = QHashPrivate::Data<QHashPrivate::Node<FixStringCacheKey,_QString>_>::Bucket::isUnused
                      ((Bucket *)0x328fcc);
    if (bVar1) {
      local_18 = (piter)end((QHash<FixStringCacheKey,_QString> *)in_stack_ffffffffffffffa8);
    }
    else {
      QHashPrivate::Data<QHashPrivate::Node<FixStringCacheKey,_QString>_>::Bucket::toBucketIndex
                (&local_28,*(Data<QHashPrivate::Node<FixStringCacheKey,_QString>_> **)in_RDI);
      it_00.bucket = (size_t)in_stack_ffffffffffffffa8;
      it_00.d = in_stack_ffffffffffffffa0;
      const_iterator::const_iterator(in_stack_ffffffffffffff98,it_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (const_iterator)local_18;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }